

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int int_id;
  float fVar4;
  char *item_text;
  ImGuiListClipper clipper;
  bool local_5c;
  char *local_58;
  ImGuiListClipper local_50;
  ImVec2 local_38;
  
  iVar3 = 7;
  if (items_count < 7) {
    iVar3 = items_count;
  }
  if (-1 < height_in_items) {
    iVar3 = height_in_items;
  }
  fVar4 = (float)iVar3;
  if (iVar3 < items_count) {
    fVar4 = fVar4 + 0.4;
  }
  local_50.StartPosY = 0.0;
  local_50.ItemsHeight = (GImGui->Style).ItemSpacing.y;
  local_50.ItemsHeight = (GImGui->FontSize + local_50.ItemsHeight) * fVar4 + local_50.ItemsHeight;
  bVar2 = ListBoxHeader(label,(ImVec2 *)&local_50);
  if (bVar2) {
    ImGuiListClipper::Begin(&local_50,items_count,GImGui->FontSize + (GImGui->Style).ItemSpacing.y);
    bVar2 = ImGuiListClipper::Step(&local_50);
    if (bVar2) {
      local_5c = false;
      do {
        iVar3 = local_50.DisplayEnd;
        int_id = local_50.DisplayStart;
        if (local_50.DisplayStart < local_50.DisplayEnd) {
          do {
            iVar1 = *current_item;
            bVar2 = (*items_getter)(data,int_id,&local_58);
            if (!bVar2) {
              local_58 = "*Unknown item*";
            }
            PushID(int_id);
            local_38.x = 0.0;
            local_38.y = 0.0;
            bVar2 = Selectable(local_58,int_id == iVar1,0,&local_38);
            if (bVar2) {
              *current_item = int_id;
              local_5c = true;
            }
            PopID();
            int_id = int_id + 1;
          } while (iVar3 != int_id);
        }
        bVar2 = ImGuiListClipper::Step(&local_50);
      } while (bVar2);
    }
    else {
      local_5c = false;
    }
    ListBoxFooter();
    if (local_50.ItemsCount != -1) {
      __assert_fail("ItemsCount == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x441,"ImGuiListClipper::~ImGuiListClipper()");
    }
  }
  else {
    local_5c = false;
  }
  return local_5c;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    if (!ListBoxHeader(label, items_count, height_in_items))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different or variable sizes you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper(items_count, GetTextLineHeightWithSpacing());
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const bool item_selected = (i == *current_item);
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            PopID();
        }
    ListBoxFooter();
    return value_changed;
}